

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall
CLI::RequiresError::RequiresError(RequiresError *this,string *msg,ExitCodes exit_code)

{
  undefined4 in_EDX;
  ParseError *in_RSI;
  undefined8 *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  allocator<char> local_39 [21];
  ExitCodes in_stack_ffffffffffffffdc;
  string *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8,
             (allocator<char> *)in_stack_ffffffffffffffa0);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &stack0xffffffffffffff90;
  ::std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  ParseError::ParseError
            (in_RSI,(string *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe0,
             in_stack_ffffffffffffffdc);
  ::std::__cxx11::string::~string(this_00);
  ::std::__cxx11::string::~string(this_00);
  ::std::allocator<char>::~allocator(local_39);
  *in_RDI = &PTR__RequiresError_00a46140;
  return;
}

Assistant:

RequiresError(std::string curname, std::string subname)
        : RequiresError(curname + " requires " + subname, ExitCodes::RequiresError) {}